

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O2

void __thiscall
GuidedMeshNormalFiltering::getAllFaceNeighborGMNF
          (GuidedMeshNormalFiltering *this,TriMesh *mesh,FaceNeighborType face_neighbor_type,
          double radius,bool include_central_face,
          vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
          *all_face_neighbor)

{
  FaceIter FVar1;
  undefined1 auStack_68 [8];
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_neighbor;
  undefined1 local_48 [8];
  FaceIter f_it;
  
  auStack_68 = (undefined1  [8])0x0;
  face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)radius;
  f_it._8_8_ = this;
  _local_48 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
  while( true ) {
    FVar1 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
    if ((BaseHandle)f_it.mesh_._0_4_ == FVar1.hnd_.super_BaseHandle.idx_.super_BaseHandle &&
        local_48 == (undefined1  [8])FVar1.mesh_) break;
    if (face_neighbor_type == kRadiusBased) {
      getRadiusBasedFaceNeighbor
                ((GuidedMeshNormalFiltering *)f_it._8_8_,mesh,(FaceHandle)f_it.mesh_._0_4_,
                 (double)face_neighbor.
                         super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)auStack_68);
    }
    else if (face_neighbor_type == kVertexBased) {
      getVertexBasedFaceNeighbor
                ((GuidedMeshNormalFiltering *)f_it._8_8_,mesh,(FaceHandle)f_it.mesh_._0_4_,
                 (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)auStack_68);
    }
    if (include_central_face) {
      std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::push_back
                ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)auStack_68,
                 (value_type *)&f_it);
    }
    std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::operator=
              ((all_face_neighbor->
               super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + f_it.mesh_._0_4_,
               (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)auStack_68);
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  *)local_48,0);
  }
  std::_Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::~_Vector_base
            ((_Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)auStack_68
            );
  return;
}

Assistant:

void GuidedMeshNormalFiltering::getAllFaceNeighborGMNF(TriMesh &mesh, MeshDenoisingBase::FaceNeighborType face_neighbor_type, double radius, bool include_central_face,
                                                       std::vector<std::vector<TriMesh::FaceHandle> > &all_face_neighbor)
{
    std::vector<TriMesh::FaceHandle> face_neighbor;
    for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
    {
        if(face_neighbor_type == kVertexBased)
            getVertexBasedFaceNeighbor(mesh, *f_it, face_neighbor);
        else if(face_neighbor_type == kRadiusBased)
            getRadiusBasedFaceNeighbor(mesh, *f_it, radius, face_neighbor);

        if(include_central_face)
            face_neighbor.push_back(*f_it);
        all_face_neighbor[f_it->idx()] = face_neighbor;
    }
}